

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::handle_invalid_expression(CompilerGLSL *this,uint32_t id)

{
  size_type sVar1;
  uint32_t local_14;
  CompilerGLSL *pCStack_10;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  local_14 = id;
  pCStack_10 = this;
  force_temporary_and_recompile(this,id);
  sVar1 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->composite_insert_overwritten,&local_14);
  if (sVar1 != 0) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->block_composite_insert_overwrite,&local_14);
  }
  return;
}

Assistant:

void CompilerGLSL::handle_invalid_expression(uint32_t id)
{
	// We tried to read an invalidated expression.
	// This means we need another pass at compilation, but next time,
	// force temporary variables so that they cannot be invalidated.
	force_temporary_and_recompile(id);

	// If the invalid expression happened as a result of a CompositeInsert
	// overwrite, we must block this from happening next iteration.
	if (composite_insert_overwritten.count(id))
		block_composite_insert_overwrite.insert(id);
}